

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O3

WebAssemblyMemory *
Js::WebAssemblyMemory::CreateForExistingBuffer
          (uint32 initial,uint32 maximum,uint32 currentByteLength,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ArrayBufferBase *buffer;
  undefined4 *puVar4;
  Recycler *alloc;
  WebAssemblyMemory *this;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  CheckLimits(scriptContext,initial,maximum,currentByteLength);
  buffer = (ArrayBufferBase *)
           JavascriptLibrary::CreateWebAssemblyArrayBuffer
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,currentByteLength);
  if (buffer == (ArrayBufferBase *)0x0) {
    AssertCount = AssertCount + 1;
    data._36_4_ = maximum;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x140,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    maximum = data._36_4_;
  }
  if ((currentByteLength != 0) &&
     (iVar3 = (*(buffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(buffer), iVar3 == 0
     )) {
    return (WebAssemblyMemory *)0x0;
  }
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9658d27;
  data.filename._0_4_ = 0x146;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this = (WebAssemblyMemory *)new<Memory::Recycler>(0x30,alloc,0x39e810);
  WebAssemblyMemory(this,buffer,initial,maximum,
                    (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                    webAssemblyMemoryType).ptr);
  return this;
}

Assistant:

WebAssemblyMemory * WebAssemblyMemory::CreateForExistingBuffer(uint32 initial, uint32 maximum, uint32 currentByteLength, ScriptContext * scriptContext)
{
    CheckLimits(scriptContext, initial, maximum, currentByteLength);
    ArrayBufferBase* buffer = scriptContext->GetLibrary()->CreateWebAssemblyArrayBuffer(currentByteLength);
    Assert(buffer);
    if (currentByteLength > 0 && buffer->GetByteLength() == 0)
    {
        // Failed to allocate buffer
        return nullptr;
    }
    return RecyclerNewFinalized(scriptContext->GetRecycler(), WebAssemblyMemory, buffer, initial, maximum, scriptContext->GetLibrary()->GetWebAssemblyMemoryType());
}